

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void caffe::protobuf_caffe_2eproto::TableStruct::InitDefaultsImpl(void)

{
  long *local_50;
  undefined8 local_48;
  long local_40;
  undefined1 local_38;
  
  google::protobuf::internal::VerifyVersion
            (0x2dd278,0x2dd278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
            );
  google::protobuf::internal::InitProtobufDefaults();
  BlobShape::BlobShape((BlobShape *)&_BlobShape_default_instance_);
  DAT_00720010 = 1;
  BlobProto::BlobProto((BlobProto *)&_BlobProto_default_instance_);
  DAT_007200a8 = 1;
  BlobProtoVector::BlobProtoVector((BlobProtoVector *)&_BlobProtoVector_default_instance_);
  DAT_007200e0 = 1;
  Datum::Datum((Datum *)&_Datum_default_instance_);
  DAT_00720130 = 1;
  FillerParameter::_default_type__abi_cxx11_ = &DAT_00721800;
  DAT_007217f8 = 0;
  DAT_00721800._0_1_ = 0;
  DAT_00721810 = 1;
  local_40 = 0x746e6174736e6f63;
  local_48 = 8;
  local_38 = 0;
  local_50 = &local_40;
  std::__cxx11::string::operator=
            ((string *)&FillerParameter::_default_type__abi_cxx11_,(string *)&local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  FillerParameter::FillerParameter((FillerParameter *)&_FillerParameter_default_instance_);
  DAT_00720178 = 1;
  NetParameter::NetParameter((NetParameter *)&_NetParameter_default_instance_);
  DAT_00720220 = 1;
  SolverParameter::_default_regularization_type__abi_cxx11_ = &DAT_00721828;
  DAT_00721820 = 0;
  DAT_00721828._0_1_ = 0;
  DAT_00721838 = 1;
  local_48 = 2;
  local_40 = CONCAT53(local_40._3_5_,0x324c);
  local_50 = &local_40;
  std::__cxx11::string::operator=
            ((string *)&SolverParameter::_default_regularization_type__abi_cxx11_,
             (string *)&local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  SolverParameter::_default_type__abi_cxx11_ = &DAT_00721850;
  DAT_00721848 = 0;
  DAT_00721850._0_1_ = 0;
  DAT_00721860 = 1;
  local_40 = CONCAT44(local_40._4_4_,0x444753);
  local_48 = 3;
  local_50 = &local_40;
  std::__cxx11::string::operator=
            ((string *)&SolverParameter::_default_type__abi_cxx11_,(string *)&local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  SolverParameter::SolverParameter((SolverParameter *)&_SolverParameter_default_instance_);
  DAT_00720358 = 1;
  SolverState::SolverState((SolverState *)&_SolverState_default_instance_);
  DAT_007203a0 = 1;
  NetState::NetState((NetState *)&_NetState_default_instance_);
  DAT_007203e0 = 1;
  NetStateRule::NetStateRule((NetStateRule *)&_NetStateRule_default_instance_);
  DAT_00720440 = 1;
  ParamSpec::ParamSpec((ParamSpec *)&_ParamSpec_default_instance_);
  DAT_00720478 = 1;
  LayerParameter::LayerParameter((LayerParameter *)&_LayerParameter_default_instance_);
  DAT_007206d8 = 1;
  TransformationParameter::TransformationParameter
            ((TransformationParameter *)&_TransformationParameter_default_instance_);
  DAT_00720720 = 1;
  LossParameter::LossParameter((LossParameter *)&_LossParameter_default_instance_);
  DAT_00720750 = 1;
  AccuracyParameter::AccuracyParameter((AccuracyParameter *)&_AccuracyParameter_default_instance_);
  DAT_00720780 = 1;
  ArgMaxParameter::ArgMaxParameter((ArgMaxParameter *)&_ArgMaxParameter_default_instance_);
  DAT_007207b0 = 1;
  ConcatParameter::ConcatParameter((ConcatParameter *)&_ConcatParameter_default_instance_);
  DAT_007207d8 = 1;
  BatchNormParameter::BatchNormParameter
            ((BatchNormParameter *)&_BatchNormParameter_default_instance_);
  DAT_00720808 = 1;
  BiasParameter::BiasParameter((BiasParameter *)&_BiasParameter_default_instance_);
  DAT_00720838 = 1;
  ContrastiveLossParameter::ContrastiveLossParameter
            ((ContrastiveLossParameter *)&_ContrastiveLossParameter_default_instance_);
  DAT_00720860 = 1;
  ConvolutionParameter::ConvolutionParameter
            ((ConvolutionParameter *)&_ConvolutionParameter_default_instance_);
  DAT_00720900 = 1;
  CropParameter::CropParameter((CropParameter *)&_CropParameter_default_instance_);
  DAT_00720938 = 1;
  DataParameter::DataParameter((DataParameter *)&_DataParameter_default_instance_);
  DAT_00720988 = 1;
  DropoutParameter::DropoutParameter((DropoutParameter *)&_DropoutParameter_default_instance_);
  DAT_007209b0 = 1;
  DummyDataParameter::DummyDataParameter
            ((DummyDataParameter *)&_DummyDataParameter_default_instance_);
  DAT_00720a40 = 1;
  EltwiseParameter::EltwiseParameter((EltwiseParameter *)&_EltwiseParameter_default_instance_);
  DAT_00720a78 = 1;
  ELUParameter::ELUParameter((ELUParameter *)&_ELUParameter_default_instance_);
  DAT_00720aa0 = 1;
  EmbedParameter::EmbedParameter((EmbedParameter *)&_EmbedParameter_default_instance_);
  DAT_00720ae0 = 1;
  ExpParameter::ExpParameter((ExpParameter *)&_ExpParameter_default_instance_);
  DAT_00720b10 = 1;
  FlattenParameter::FlattenParameter((FlattenParameter *)&_FlattenParameter_default_instance_);
  DAT_00720b38 = 1;
  HDF5DataParameter::HDF5DataParameter((HDF5DataParameter *)&_HDF5DataParameter_default_instance_);
  DAT_00720b68 = 1;
  HDF5OutputParameter::HDF5OutputParameter
            ((HDF5OutputParameter *)&_HDF5OutputParameter_default_instance_);
  DAT_00720b90 = 1;
  HingeLossParameter::HingeLossParameter
            ((HingeLossParameter *)&_HingeLossParameter_default_instance_);
  DAT_00720bb8 = 1;
  ImageDataParameter::ImageDataParameter
            ((ImageDataParameter *)&_ImageDataParameter_default_instance_);
  DAT_00720c10 = 1;
  InfogainLossParameter::InfogainLossParameter
            ((InfogainLossParameter *)&_InfogainLossParameter_default_instance_);
  DAT_00720c38 = 1;
  InnerProductParameter::InnerProductParameter
            ((InnerProductParameter *)&_InnerProductParameter_default_instance_);
  DAT_00720c78 = 1;
  InputParameter::InputParameter((InputParameter *)&_InputParameter_default_instance_);
  DAT_00720cb0 = 1;
  LogParameter::LogParameter((LogParameter *)&_LogParameter_default_instance_);
  DAT_00720ce0 = 1;
  LRNParameter::LRNParameter((LRNParameter *)&_LRNParameter_default_instance_);
  DAT_00720d18 = 1;
  MemoryDataParameter::MemoryDataParameter
            ((MemoryDataParameter *)&_MemoryDataParameter_default_instance_);
  DAT_00720d48 = 1;
  MVNParameter::MVNParameter((MVNParameter *)&_MVNParameter_default_instance_);
  DAT_00720d70 = 1;
  ParameterParameter::ParameterParameter
            ((ParameterParameter *)&_ParameterParameter_default_instance_);
  DAT_00720d98 = 1;
  PoolingParameter::PoolingParameter((PoolingParameter *)&_PoolingParameter_default_instance_);
  DAT_00720de8 = 1;
  PowerParameter::PowerParameter((PowerParameter *)&_PowerParameter_default_instance_);
  DAT_00720e18 = 1;
  PythonParameter::PythonParameter((PythonParameter *)&_PythonParameter_default_instance_);
  DAT_00720e58 = 1;
  RecurrentParameter::RecurrentParameter
            ((RecurrentParameter *)&_RecurrentParameter_default_instance_);
  DAT_00720e90 = 1;
  ReductionParameter::ReductionParameter
            ((ReductionParameter *)&_ReductionParameter_default_instance_);
  DAT_00720ec0 = 1;
  ReLUParameter::ReLUParameter((ReLUParameter *)&_ReLUParameter_default_instance_);
  DAT_00720ee8 = 1;
  ReshapeParameter::ReshapeParameter((ReshapeParameter *)&_ReshapeParameter_default_instance_);
  DAT_00720f18 = 1;
  ScaleParameter::ScaleParameter((ScaleParameter *)&_ScaleParameter_default_instance_);
  DAT_00720f58 = 1;
  SigmoidParameter::SigmoidParameter((SigmoidParameter *)&_SigmoidParameter_default_instance_);
  DAT_00720f80 = 1;
  SliceParameter::SliceParameter((SliceParameter *)&_SliceParameter_default_instance_);
  DAT_00720fb8 = 1;
  SoftmaxParameter::SoftmaxParameter((SoftmaxParameter *)&_SoftmaxParameter_default_instance_);
  DAT_00720fe0 = 1;
  TanHParameter::TanHParameter((TanHParameter *)&_TanHParameter_default_instance_);
  DAT_00721008 = 1;
  TileParameter::TileParameter((TileParameter *)&_TileParameter_default_instance_);
  DAT_00721030 = 1;
  ThresholdParameter::ThresholdParameter
            ((ThresholdParameter *)&_ThresholdParameter_default_instance_);
  DAT_00721058 = 1;
  WindowDataParameter::_default_crop_mode__abi_cxx11_ = &DAT_00721878;
  DAT_00721870 = 0;
  DAT_00721878._0_1_ = 0;
  DAT_00721888 = 1;
  local_48 = 4;
  local_40 = CONCAT35(local_40._5_3_,0x70726177);
  local_50 = &local_40;
  std::__cxx11::string::operator=
            ((string *)&WindowDataParameter::_default_crop_mode__abi_cxx11_,(string *)&local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  WindowDataParameter::WindowDataParameter
            ((WindowDataParameter *)&_WindowDataParameter_default_instance_);
  DAT_007210b8 = 1;
  SPPParameter::SPPParameter((SPPParameter *)&_SPPParameter_default_instance_);
  DAT_007210e8 = 1;
  V1LayerParameter::V1LayerParameter((V1LayerParameter *)&_V1LayerParameter_default_instance_);
  DAT_007212e0 = 1;
  V0LayerParameter::_default_det_crop_mode__abi_cxx11_ = &DAT_007218a0;
  DAT_00721898 = 0;
  DAT_007218a0._0_1_ = 0;
  DAT_007218b0 = 1;
  local_48 = 4;
  local_40 = CONCAT35(local_40._5_3_,0x70726177);
  local_50 = &local_40;
  std::__cxx11::string::operator=
            ((string *)&V0LayerParameter::_default_det_crop_mode__abi_cxx11_,(string *)&local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  V0LayerParameter::V0LayerParameter((V0LayerParameter *)&_V0LayerParameter_default_instance_);
  DAT_007213e8 = 1;
  PReLUParameter::PReLUParameter((PReLUParameter *)&_PReLUParameter_default_instance_);
  _DAT_00720210 = &_NetState_default_instance_;
  _DAT_007202e0 = &_NetParameter_default_instance_;
  _DAT_007202d8 = &_NetParameter_default_instance_;
  _DAT_007202e8 = &_NetState_default_instance_;
  _DAT_00720090 = &_BlobShape_default_instance_;
  _DAT_00720558 = &_TransformationParameter_default_instance_;
  _DAT_00720560 = &_LossParameter_default_instance_;
  _DAT_00720568 = &_AccuracyParameter_default_instance_;
  _DAT_00720570 = &_ArgMaxParameter_default_instance_;
  _DAT_00720690 = &_BatchNormParameter_default_instance_;
  _DAT_007206a0 = &_BiasParameter_default_instance_;
  _DAT_00720578 = &_ConcatParameter_default_instance_;
  _DAT_00720580 = &_ContrastiveLossParameter_default_instance_;
  _DAT_00720588 = &_ConvolutionParameter_default_instance_;
  _DAT_007206b8 = &_CropParameter_default_instance_;
  _DAT_00720590 = &_DataParameter_default_instance_;
  _DAT_00720598 = &_DropoutParameter_default_instance_;
  _DAT_007205a0 = &_DummyDataParameter_default_instance_;
  _DAT_007205a8 = &_EltwiseParameter_default_instance_;
  _DAT_00720698 = &_ELUParameter_default_instance_;
  _DAT_00720680 = &_EmbedParameter_default_instance_;
  _DAT_007205b0 = &_ExpParameter_default_instance_;
  _DAT_00720670 = &_FlattenParameter_default_instance_;
  _DAT_007205b8 = &_HDF5DataParameter_default_instance_;
  _DAT_007205c0 = &_HDF5OutputParameter_default_instance_;
  _DAT_007205c8 = &_HingeLossParameter_default_instance_;
  _DAT_007205d0 = &_ImageDataParameter_default_instance_;
  _DAT_007205d8 = &_InfogainLossParameter_default_instance_;
  _DAT_007205e0 = &_InnerProductParameter_default_instance_;
  _DAT_007206b0 = &_InputParameter_default_instance_;
  _DAT_00720668 = &_LogParameter_default_instance_;
  _DAT_007205e8 = &_LRNParameter_default_instance_;
  _DAT_007205f0 = &_MemoryDataParameter_default_instance_;
  _DAT_007205f8 = &_MVNParameter_default_instance_;
  _DAT_007206c0 = &_ParameterParameter_default_instance_;
  _DAT_00720600 = &_PoolingParameter_default_instance_;
  _DAT_00720608 = &_PowerParameter_default_instance_;
  _DAT_00720650 = &_PReLUParameter_default_instance_;
  _DAT_00720648 = &_PythonParameter_default_instance_;
  _DAT_007206c8 = &_RecurrentParameter_default_instance_;
  _DAT_00720678 = &_ReductionParameter_default_instance_;
  DAT_00720d90 = &_BlobShape_default_instance_;
  DAT_00720f08 = &_BlobShape_default_instance_;
  _DAT_00720610 = &_ReLUParameter_default_instance_;
  _DAT_00720660 = &_ReshapeParameter_default_instance_;
  _DAT_007206a8 = &_ScaleParameter_default_instance_;
  _DAT_00720618 = &_SigmoidParameter_default_instance_;
  _DAT_00720620 = &_SoftmaxParameter_default_instance_;
  _DAT_00720658 = &_SPPParameter_default_instance_;
  _DAT_00720628 = &_SliceParameter_default_instance_;
  _DAT_00720630 = &_TanHParameter_default_instance_;
  _DAT_00720638 = &_ThresholdParameter_default_instance_;
  _DAT_00720688 = &_TileParameter_default_instance_;
  _DAT_00720640 = &_WindowDataParameter_default_instance_;
  _DAT_00721278 = &_AccuracyParameter_default_instance_;
  _DAT_00721258 = &_ArgMaxParameter_default_instance_;
  _DAT_007211e8 = &_ConcatParameter_default_instance_;
  _DAT_007212c0 = &_ContrastiveLossParameter_default_instance_;
  _DAT_007211f0 = &_ConvolutionParameter_default_instance_;
  _DAT_007211f8 = &_DataParameter_default_instance_;
  _DAT_00721200 = &_DropoutParameter_default_instance_;
  _DAT_00721270 = &_DummyDataParameter_default_instance_;
  _DAT_00721260 = &_EltwiseParameter_default_instance_;
  _DAT_007212c8 = &_ExpParameter_default_instance_;
  _DAT_00721208 = &_HDF5DataParameter_default_instance_;
  _DAT_00721210 = &_HDF5OutputParameter_default_instance_;
  _DAT_00721280 = &_HingeLossParameter_default_instance_;
  _DAT_00721218 = &_ImageDataParameter_default_instance_;
  _DAT_00721220 = &_InfogainLossParameter_default_instance_;
  _DAT_00721228 = &_InnerProductParameter_default_instance_;
  _DAT_00721230 = &_LRNParameter_default_instance_;
  _DAT_00721250 = &_MemoryDataParameter_default_instance_;
  _DAT_00721298 = &_MVNParameter_default_instance_;
  _DAT_00721238 = &_PoolingParameter_default_instance_;
  _DAT_00721248 = &_PowerParameter_default_instance_;
  _DAT_00721288 = &_ReLUParameter_default_instance_;
  _DAT_007212b0 = &_SigmoidParameter_default_instance_;
  _DAT_007212b8 = &_SoftmaxParameter_default_instance_;
  _DAT_00721290 = &_SliceParameter_default_instance_;
  _DAT_007212a8 = &_TanHParameter_default_instance_;
  _DAT_00721268 = &_ThresholdParameter_default_instance_;
  _DAT_00721240 = &_WindowDataParameter_default_instance_;
  _DAT_007212a0 = &_TransformationParameter_default_instance_;
  _DAT_007212d0 = &_LossParameter_default_instance_;
  _DAT_007211e0 = &_V0LayerParameter_default_instance_;
  _DAT_00721360 = &_FillerParameter_default_instance_;
  _DAT_00721368 = &_FillerParameter_default_instance_;
  _DAT_00721370 = &_HDF5OutputParameter_default_instance_;
  _DAT_00720828 = &_FillerParameter_default_instance_;
  _DAT_007208c0 = &_FillerParameter_default_instance_;
  _DAT_007208c8 = &_FillerParameter_default_instance_;
  _DAT_00720ac0 = &_FillerParameter_default_instance_;
  _DAT_00720ac8 = &_FillerParameter_default_instance_;
  _DAT_00720c58 = &_FillerParameter_default_instance_;
  _DAT_00720c60 = &_FillerParameter_default_instance_;
  _DAT_00720e78 = &_FillerParameter_default_instance_;
  _DAT_00720e80 = &_FillerParameter_default_instance_;
  _DAT_00720f38 = &_FillerParameter_default_instance_;
  _DAT_00720f40 = &_FillerParameter_default_instance_;
  DAT_00721418 = 1;
  _DAT_00721408 = &_FillerParameter_default_instance_;
  return;
}

Assistant:

void TableStruct::InitDefaultsImpl() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::internal::InitProtobufDefaults();
  _BlobShape_default_instance_.DefaultConstruct();
  _BlobProto_default_instance_.DefaultConstruct();
  _BlobProtoVector_default_instance_.DefaultConstruct();
  _Datum_default_instance_.DefaultConstruct();
  FillerParameter::_default_type_.DefaultConstruct();
  *FillerParameter::_default_type_.get_mutable() = ::std::string("constant", 8);
  _FillerParameter_default_instance_.DefaultConstruct();
  _NetParameter_default_instance_.DefaultConstruct();
  SolverParameter::_default_regularization_type_.DefaultConstruct();
  *SolverParameter::_default_regularization_type_.get_mutable() = ::std::string("L2", 2);
  SolverParameter::_default_type_.DefaultConstruct();
  *SolverParameter::_default_type_.get_mutable() = ::std::string("SGD", 3);
  _SolverParameter_default_instance_.DefaultConstruct();
  _SolverState_default_instance_.DefaultConstruct();
  _NetState_default_instance_.DefaultConstruct();
  _NetStateRule_default_instance_.DefaultConstruct();
  _ParamSpec_default_instance_.DefaultConstruct();
  _LayerParameter_default_instance_.DefaultConstruct();
  _TransformationParameter_default_instance_.DefaultConstruct();
  _LossParameter_default_instance_.DefaultConstruct();
  _AccuracyParameter_default_instance_.DefaultConstruct();
  _ArgMaxParameter_default_instance_.DefaultConstruct();
  _ConcatParameter_default_instance_.DefaultConstruct();
  _BatchNormParameter_default_instance_.DefaultConstruct();
  _BiasParameter_default_instance_.DefaultConstruct();
  _ContrastiveLossParameter_default_instance_.DefaultConstruct();
  _ConvolutionParameter_default_instance_.DefaultConstruct();
  _CropParameter_default_instance_.DefaultConstruct();
  _DataParameter_default_instance_.DefaultConstruct();
  _DropoutParameter_default_instance_.DefaultConstruct();
  _DummyDataParameter_default_instance_.DefaultConstruct();
  _EltwiseParameter_default_instance_.DefaultConstruct();
  _ELUParameter_default_instance_.DefaultConstruct();
  _EmbedParameter_default_instance_.DefaultConstruct();
  _ExpParameter_default_instance_.DefaultConstruct();
  _FlattenParameter_default_instance_.DefaultConstruct();
  _HDF5DataParameter_default_instance_.DefaultConstruct();
  _HDF5OutputParameter_default_instance_.DefaultConstruct();
  _HingeLossParameter_default_instance_.DefaultConstruct();
  _ImageDataParameter_default_instance_.DefaultConstruct();
  _InfogainLossParameter_default_instance_.DefaultConstruct();
  _InnerProductParameter_default_instance_.DefaultConstruct();
  _InputParameter_default_instance_.DefaultConstruct();
  _LogParameter_default_instance_.DefaultConstruct();
  _LRNParameter_default_instance_.DefaultConstruct();
  _MemoryDataParameter_default_instance_.DefaultConstruct();
  _MVNParameter_default_instance_.DefaultConstruct();
  _ParameterParameter_default_instance_.DefaultConstruct();
  _PoolingParameter_default_instance_.DefaultConstruct();
  _PowerParameter_default_instance_.DefaultConstruct();
  _PythonParameter_default_instance_.DefaultConstruct();
  _RecurrentParameter_default_instance_.DefaultConstruct();
  _ReductionParameter_default_instance_.DefaultConstruct();
  _ReLUParameter_default_instance_.DefaultConstruct();
  _ReshapeParameter_default_instance_.DefaultConstruct();
  _ScaleParameter_default_instance_.DefaultConstruct();
  _SigmoidParameter_default_instance_.DefaultConstruct();
  _SliceParameter_default_instance_.DefaultConstruct();
  _SoftmaxParameter_default_instance_.DefaultConstruct();
  _TanHParameter_default_instance_.DefaultConstruct();
  _TileParameter_default_instance_.DefaultConstruct();
  _ThresholdParameter_default_instance_.DefaultConstruct();
  WindowDataParameter::_default_crop_mode_.DefaultConstruct();
  *WindowDataParameter::_default_crop_mode_.get_mutable() = ::std::string("warp", 4);
  _WindowDataParameter_default_instance_.DefaultConstruct();
  _SPPParameter_default_instance_.DefaultConstruct();
  _V1LayerParameter_default_instance_.DefaultConstruct();
  V0LayerParameter::_default_det_crop_mode_.DefaultConstruct();
  *V0LayerParameter::_default_det_crop_mode_.get_mutable() = ::std::string("warp", 4);
  _V0LayerParameter_default_instance_.DefaultConstruct();
  _PReLUParameter_default_instance_.DefaultConstruct();
  _BlobProto_default_instance_.get_mutable()->shape_ = const_cast< ::caffe::BlobShape*>(
      ::caffe::BlobShape::internal_default_instance());
  _NetParameter_default_instance_.get_mutable()->state_ = const_cast< ::caffe::NetState*>(
      ::caffe::NetState::internal_default_instance());
  _SolverParameter_default_instance_.get_mutable()->net_param_ = const_cast< ::caffe::NetParameter*>(
      ::caffe::NetParameter::internal_default_instance());
  _SolverParameter_default_instance_.get_mutable()->train_net_param_ = const_cast< ::caffe::NetParameter*>(
      ::caffe::NetParameter::internal_default_instance());
  _SolverParameter_default_instance_.get_mutable()->train_state_ = const_cast< ::caffe::NetState*>(
      ::caffe::NetState::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->transform_param_ = const_cast< ::caffe::TransformationParameter*>(
      ::caffe::TransformationParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->loss_param_ = const_cast< ::caffe::LossParameter*>(
      ::caffe::LossParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->accuracy_param_ = const_cast< ::caffe::AccuracyParameter*>(
      ::caffe::AccuracyParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->argmax_param_ = const_cast< ::caffe::ArgMaxParameter*>(
      ::caffe::ArgMaxParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->batch_norm_param_ = const_cast< ::caffe::BatchNormParameter*>(
      ::caffe::BatchNormParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->bias_param_ = const_cast< ::caffe::BiasParameter*>(
      ::caffe::BiasParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->concat_param_ = const_cast< ::caffe::ConcatParameter*>(
      ::caffe::ConcatParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->contrastive_loss_param_ = const_cast< ::caffe::ContrastiveLossParameter*>(
      ::caffe::ContrastiveLossParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->convolution_param_ = const_cast< ::caffe::ConvolutionParameter*>(
      ::caffe::ConvolutionParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->crop_param_ = const_cast< ::caffe::CropParameter*>(
      ::caffe::CropParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->data_param_ = const_cast< ::caffe::DataParameter*>(
      ::caffe::DataParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->dropout_param_ = const_cast< ::caffe::DropoutParameter*>(
      ::caffe::DropoutParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->dummy_data_param_ = const_cast< ::caffe::DummyDataParameter*>(
      ::caffe::DummyDataParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->eltwise_param_ = const_cast< ::caffe::EltwiseParameter*>(
      ::caffe::EltwiseParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->elu_param_ = const_cast< ::caffe::ELUParameter*>(
      ::caffe::ELUParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->embed_param_ = const_cast< ::caffe::EmbedParameter*>(
      ::caffe::EmbedParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->exp_param_ = const_cast< ::caffe::ExpParameter*>(
      ::caffe::ExpParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->flatten_param_ = const_cast< ::caffe::FlattenParameter*>(
      ::caffe::FlattenParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->hdf5_data_param_ = const_cast< ::caffe::HDF5DataParameter*>(
      ::caffe::HDF5DataParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->hdf5_output_param_ = const_cast< ::caffe::HDF5OutputParameter*>(
      ::caffe::HDF5OutputParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->hinge_loss_param_ = const_cast< ::caffe::HingeLossParameter*>(
      ::caffe::HingeLossParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->image_data_param_ = const_cast< ::caffe::ImageDataParameter*>(
      ::caffe::ImageDataParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->infogain_loss_param_ = const_cast< ::caffe::InfogainLossParameter*>(
      ::caffe::InfogainLossParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->inner_product_param_ = const_cast< ::caffe::InnerProductParameter*>(
      ::caffe::InnerProductParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->input_param_ = const_cast< ::caffe::InputParameter*>(
      ::caffe::InputParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->log_param_ = const_cast< ::caffe::LogParameter*>(
      ::caffe::LogParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->lrn_param_ = const_cast< ::caffe::LRNParameter*>(
      ::caffe::LRNParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->memory_data_param_ = const_cast< ::caffe::MemoryDataParameter*>(
      ::caffe::MemoryDataParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->mvn_param_ = const_cast< ::caffe::MVNParameter*>(
      ::caffe::MVNParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->parameter_param_ = const_cast< ::caffe::ParameterParameter*>(
      ::caffe::ParameterParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->pooling_param_ = const_cast< ::caffe::PoolingParameter*>(
      ::caffe::PoolingParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->power_param_ = const_cast< ::caffe::PowerParameter*>(
      ::caffe::PowerParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->prelu_param_ = const_cast< ::caffe::PReLUParameter*>(
      ::caffe::PReLUParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->python_param_ = const_cast< ::caffe::PythonParameter*>(
      ::caffe::PythonParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->recurrent_param_ = const_cast< ::caffe::RecurrentParameter*>(
      ::caffe::RecurrentParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->reduction_param_ = const_cast< ::caffe::ReductionParameter*>(
      ::caffe::ReductionParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->relu_param_ = const_cast< ::caffe::ReLUParameter*>(
      ::caffe::ReLUParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->reshape_param_ = const_cast< ::caffe::ReshapeParameter*>(
      ::caffe::ReshapeParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->scale_param_ = const_cast< ::caffe::ScaleParameter*>(
      ::caffe::ScaleParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->sigmoid_param_ = const_cast< ::caffe::SigmoidParameter*>(
      ::caffe::SigmoidParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->softmax_param_ = const_cast< ::caffe::SoftmaxParameter*>(
      ::caffe::SoftmaxParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->spp_param_ = const_cast< ::caffe::SPPParameter*>(
      ::caffe::SPPParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->slice_param_ = const_cast< ::caffe::SliceParameter*>(
      ::caffe::SliceParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->tanh_param_ = const_cast< ::caffe::TanHParameter*>(
      ::caffe::TanHParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->threshold_param_ = const_cast< ::caffe::ThresholdParameter*>(
      ::caffe::ThresholdParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->tile_param_ = const_cast< ::caffe::TileParameter*>(
      ::caffe::TileParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->window_data_param_ = const_cast< ::caffe::WindowDataParameter*>(
      ::caffe::WindowDataParameter::internal_default_instance());
  _BiasParameter_default_instance_.get_mutable()->filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _ConvolutionParameter_default_instance_.get_mutable()->weight_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _ConvolutionParameter_default_instance_.get_mutable()->bias_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _EmbedParameter_default_instance_.get_mutable()->weight_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _EmbedParameter_default_instance_.get_mutable()->bias_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _InnerProductParameter_default_instance_.get_mutable()->weight_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _InnerProductParameter_default_instance_.get_mutable()->bias_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _ParameterParameter_default_instance_.get_mutable()->shape_ = const_cast< ::caffe::BlobShape*>(
      ::caffe::BlobShape::internal_default_instance());
  _RecurrentParameter_default_instance_.get_mutable()->weight_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _RecurrentParameter_default_instance_.get_mutable()->bias_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _ReshapeParameter_default_instance_.get_mutable()->shape_ = const_cast< ::caffe::BlobShape*>(
      ::caffe::BlobShape::internal_default_instance());
  _ScaleParameter_default_instance_.get_mutable()->filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _ScaleParameter_default_instance_.get_mutable()->bias_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->accuracy_param_ = const_cast< ::caffe::AccuracyParameter*>(
      ::caffe::AccuracyParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->argmax_param_ = const_cast< ::caffe::ArgMaxParameter*>(
      ::caffe::ArgMaxParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->concat_param_ = const_cast< ::caffe::ConcatParameter*>(
      ::caffe::ConcatParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->contrastive_loss_param_ = const_cast< ::caffe::ContrastiveLossParameter*>(
      ::caffe::ContrastiveLossParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->convolution_param_ = const_cast< ::caffe::ConvolutionParameter*>(
      ::caffe::ConvolutionParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->data_param_ = const_cast< ::caffe::DataParameter*>(
      ::caffe::DataParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->dropout_param_ = const_cast< ::caffe::DropoutParameter*>(
      ::caffe::DropoutParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->dummy_data_param_ = const_cast< ::caffe::DummyDataParameter*>(
      ::caffe::DummyDataParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->eltwise_param_ = const_cast< ::caffe::EltwiseParameter*>(
      ::caffe::EltwiseParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->exp_param_ = const_cast< ::caffe::ExpParameter*>(
      ::caffe::ExpParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->hdf5_data_param_ = const_cast< ::caffe::HDF5DataParameter*>(
      ::caffe::HDF5DataParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->hdf5_output_param_ = const_cast< ::caffe::HDF5OutputParameter*>(
      ::caffe::HDF5OutputParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->hinge_loss_param_ = const_cast< ::caffe::HingeLossParameter*>(
      ::caffe::HingeLossParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->image_data_param_ = const_cast< ::caffe::ImageDataParameter*>(
      ::caffe::ImageDataParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->infogain_loss_param_ = const_cast< ::caffe::InfogainLossParameter*>(
      ::caffe::InfogainLossParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->inner_product_param_ = const_cast< ::caffe::InnerProductParameter*>(
      ::caffe::InnerProductParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->lrn_param_ = const_cast< ::caffe::LRNParameter*>(
      ::caffe::LRNParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->memory_data_param_ = const_cast< ::caffe::MemoryDataParameter*>(
      ::caffe::MemoryDataParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->mvn_param_ = const_cast< ::caffe::MVNParameter*>(
      ::caffe::MVNParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->pooling_param_ = const_cast< ::caffe::PoolingParameter*>(
      ::caffe::PoolingParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->power_param_ = const_cast< ::caffe::PowerParameter*>(
      ::caffe::PowerParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->relu_param_ = const_cast< ::caffe::ReLUParameter*>(
      ::caffe::ReLUParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->sigmoid_param_ = const_cast< ::caffe::SigmoidParameter*>(
      ::caffe::SigmoidParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->softmax_param_ = const_cast< ::caffe::SoftmaxParameter*>(
      ::caffe::SoftmaxParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->slice_param_ = const_cast< ::caffe::SliceParameter*>(
      ::caffe::SliceParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->tanh_param_ = const_cast< ::caffe::TanHParameter*>(
      ::caffe::TanHParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->threshold_param_ = const_cast< ::caffe::ThresholdParameter*>(
      ::caffe::ThresholdParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->window_data_param_ = const_cast< ::caffe::WindowDataParameter*>(
      ::caffe::WindowDataParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->transform_param_ = const_cast< ::caffe::TransformationParameter*>(
      ::caffe::TransformationParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->loss_param_ = const_cast< ::caffe::LossParameter*>(
      ::caffe::LossParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->layer_ = const_cast< ::caffe::V0LayerParameter*>(
      ::caffe::V0LayerParameter::internal_default_instance());
  _V0LayerParameter_default_instance_.get_mutable()->weight_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _V0LayerParameter_default_instance_.get_mutable()->bias_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _V0LayerParameter_default_instance_.get_mutable()->hdf5_output_param_ = const_cast< ::caffe::HDF5OutputParameter*>(
      ::caffe::HDF5OutputParameter::internal_default_instance());
  _PReLUParameter_default_instance_.get_mutable()->filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
}